

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O0

int mk_utils_utime2gmt(char **data,time_t date)

{
  undefined4 *puVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  tm *ptVar8;
  tm *gtm;
  char *buf;
  unsigned_short sec;
  unsigned_short min;
  unsigned_short hour;
  unsigned_short mday;
  unsigned_short year;
  int size;
  time_t date_local;
  char **data_local;
  
  _mday = date;
  date_local = (time_t)data;
  if (date == 0) {
    _mday = time((time_t *)0x0);
    if (_mday == -1) {
      return -1;
    }
  }
  else {
    iVar7 = mk_utils_gmt_cache_get(data,date);
    if (iVar7 == 1) {
      return 0x1f;
    }
  }
  ptVar8 = (tm *)pthread_getspecific(mk_tls_cache_gmtime);
  if (ptVar8 != (tm *)0x0) {
    ptVar8 = gmtime_r((time_t *)&mday,ptVar8);
    if (ptVar8 == (tm *)0x0) {
      data_local._4_4_ = -1;
    }
    else {
      uVar2 = (short)ptVar8->tm_year + 0x76c;
      uVar3 = (ushort)ptVar8->tm_mday;
      uVar4 = (ushort)ptVar8->tm_hour;
      uVar5 = (ushort)ptVar8->tm_min;
      uVar6 = (ushort)ptVar8->tm_sec;
      puVar1 = *(undefined4 **)date_local;
      iVar7 = ptVar8->tm_wday;
      *puVar1 = *(undefined4 *)mk_date_wd[iVar7];
      *(char *)(puVar1 + 1) = mk_date_wd[iVar7][4];
      *(char *)((long)puVar1 + 5) = (char)((ulong)uVar3 / 10) + '0';
      *(char *)((long)puVar1 + 6) = (char)((ulong)uVar3 % 10) + '0';
      *(undefined1 *)((long)puVar1 + 7) = 0x20;
      puVar1[2] = *(undefined4 *)mk_date_ym[ptVar8->tm_mon];
      *(char *)(puVar1 + 3) = (char)(((ulong)uVar2 / 1000) % 10) + '0';
      *(char *)((long)puVar1 + 0xd) = (char)(((ulong)uVar2 / 100) % 10) + '0';
      *(char *)((long)puVar1 + 0xe) = (char)(((ulong)uVar2 / 10) % 10) + '0';
      *(char *)((long)puVar1 + 0xf) = (char)((ulong)uVar2 % 10) + '0';
      *(undefined1 *)(puVar1 + 4) = 0x20;
      *(char *)((long)puVar1 + 0x11) = (char)((ulong)uVar4 / 10) + '0';
      *(char *)((long)puVar1 + 0x12) = (char)((ulong)uVar4 % 10) + '0';
      *(undefined1 *)((long)puVar1 + 0x13) = 0x3a;
      *(char *)(puVar1 + 5) = (char)((ulong)uVar5 / 10) + '0';
      *(char *)((long)puVar1 + 0x15) = (char)((ulong)uVar5 % 10) + '0';
      *(undefined1 *)((long)puVar1 + 0x16) = 0x3a;
      *(char *)((long)puVar1 + 0x17) = (char)((ulong)uVar6 / 10) + '0';
      *(char *)(puVar1 + 6) = (char)((ulong)uVar6 % 10) + '0';
      *(undefined4 *)((long)puVar1 + 0x19) = 0x544d4720;
      *(undefined2 *)((long)puVar1 + 0x1d) = 0xa0d;
      *(undefined1 *)((long)puVar1 + 0x1f) = 0;
      mk_utils_gmt_cache_add(*(char **)date_local,_mday);
      data_local._4_4_ = 0x1f;
    }
    return data_local._4_4_;
  }
  mk_print(0x1003,"Bug found in %s() at %s:%d","mk_utils_utime2gmt",
           "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_utils.c",
           0xd6);
  abort();
}

Assistant:

int mk_utils_utime2gmt(char **data, time_t date)
{
    const int size = 31;
    unsigned short year, mday, hour, min, sec;
    char *buf=0;
    struct tm *gtm;

    if (date == 0) {
        if ((date = time(NULL)) == -1) {
            return -1;
        }
    }
    else {
        /* Maybe it's converted already? */
        if (mk_utils_gmt_cache_get(data, date) == MK_TRUE) {
            return size;
        }
    }

    /* Convert unix time to struct tm */
    gtm = MK_TLS_GET(mk_tls_cache_gmtime);

    /* If this function was invoked from a non-thread context it should exit */
    mk_bug(!gtm);
    gtm = gmtime_r(&date, gtm);
    if (!gtm) {
        return -1;
    }

    /* struct tm -> tm_year counts number of years after 1900 */
    year = gtm->tm_year + 1900;

    /* Signed division is slow, by using unsigned we gain 25% speed */
    mday = gtm->tm_mday;
    hour = gtm->tm_hour;
    min = gtm->tm_min;
    sec = gtm->tm_sec;

    /* Compose template */
    buf = *data;

    /* Week day */
    memcpy(buf, mk_date_wd[gtm->tm_wday], 5);
    buf += 5;

    /* Day of the month */
    *buf++ = ('0' + (mday / 10));
    *buf++ = ('0' + (mday % 10));
    *buf++ = ' ';

    /* Month */
    memcpy(buf, mk_date_ym[gtm->tm_mon], 4);
    buf += 4;

    /* Year */
    *buf++ = ('0' + (year / 1000) % 10);
    *buf++ = ('0' + (year / 100) % 10);
    *buf++ = ('0' + (year / 10) % 10);
    *buf++ = ('0' + (year % 10));
    *buf++ = ' ';

    /* Hour */
    *buf++ = ('0' + (hour / 10));
    *buf++ = ('0' + (hour % 10));
    *buf++ = ':';

    /* Minutes */
    *buf++ = ('0' + (min / 10));
    *buf++ = ('0' + (min % 10));
    *buf++ = ':';

    /* Seconds */
    *buf++ = ('0' + (sec / 10));
    *buf++ = ('0' + (sec % 10));

    /* GMT Time zone + CRLF */
    memcpy(buf, " GMT\r\n\0", 7);

    /* Add new entry to the cache */
    mk_utils_gmt_cache_add(*data, date);

    /* Set mk_ptr_t data len */
    return size;
}